

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O0

void __thiscall
OpenMD::IcosahedralOfR::IcosahedralOfR
          (IcosahedralOfR *this,SimInfo *info,string *filename,string *sele,double rCut,uint nbins,
          RealType len)

{
  StaticAnalyser *in_RDI;
  RealType in_stack_000002d0;
  uint in_stack_000002dc;
  double in_stack_000002e0;
  string *in_stack_000002e8;
  string *in_stack_000002f0;
  SimInfo *in_stack_000002f8;
  BOPofR *in_stack_00000300;
  string *in_stack_ffffffffffffff78;
  allocator<char> local_59;
  string local_58 [8];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  BOPofR::BOPofR(in_stack_00000300,in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,
                 in_stack_000002e0,in_stack_000002dc,in_stack_000002d0);
  in_RDI->_vptr_StaticAnalyser = (_func_int **)&PTR__IcosahedralOfR_0055e880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  StaticAnalyser::setAnalysisType(in_RDI,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

IcosahedralOfR::IcosahedralOfR(SimInfo* info, const std::string& filename,
                                 const std::string& sele, double rCut,
                                 unsigned int nbins, RealType len) :
      BOPofR(info, filename, sele, rCut, nbins, len) {
    setAnalysisType("Icosahedral Bond Order Parameter(r)");
  }